

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O2

uint32_t __thiscall
spvtools::opt::InstrumentPass::GenUintCastCode
          (InstrumentPass *this,uint32_t val_id,InstructionBuilder *builder)

{
  uint32_t uVar1;
  uint32_t uVar2;
  int iVar3;
  TypeManager *this_00;
  DefUseManager *this_01;
  Instruction *pIVar4;
  Type *pTVar5;
  undefined4 extraout_var;
  
  uVar1 = Gen32BitCvtCode(this,val_id,builder);
  this_00 = IRContext::get_type_mgr((this->super_Pass).context_);
  this_01 = Pass::get_def_use_mgr(&this->super_Pass);
  pIVar4 = analysis::DefUseManager::GetDef(this_01,uVar1);
  uVar2 = Instruction::type_id(pIVar4);
  pTVar5 = analysis::TypeManager::GetType(this_00,uVar2);
  iVar3 = (*pTVar5->_vptr_Type[9])(pTVar5);
  if (*(char *)(CONCAT44(extraout_var,iVar3) + 0x28) == '\x01') {
    uVar2 = GetUintId(this);
    pIVar4 = InstructionBuilder::AddUnaryOp(builder,uVar2,OpBitcast,uVar1);
    uVar1 = Instruction::result_id(pIVar4);
    return uVar1;
  }
  return uVar1;
}

Assistant:

uint32_t InstrumentPass::GenUintCastCode(uint32_t val_id,
                                         InstructionBuilder* builder) {
  // Convert value to 32-bit if necessary
  uint32_t val_32b_id = Gen32BitCvtCode(val_id, builder);
  // Cast value to unsigned if necessary
  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  uint32_t val_ty_id = get_def_use_mgr()->GetDef(val_32b_id)->type_id();
  analysis::Integer* val_ty = type_mgr->GetType(val_ty_id)->AsInteger();
  if (!val_ty->IsSigned()) return val_32b_id;
  return builder->AddUnaryOp(GetUintId(), spv::Op::OpBitcast, val_32b_id)
      ->result_id();
}